

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_signature_normalize
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sigout,
              secp256k1_ecdsa_signature *sigin)

{
  undefined1 local_68 [4];
  int ret;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_ecdsa_signature *sigin_local;
  secp256k1_ecdsa_signature *sigout_local;
  secp256k1_context *ctx_local;
  
  if (sigin == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sigin != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_ecdsa_signature_load
              (ctx,(secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)local_68,sigin);
    ctx_local._4_4_ = secp256k1_scalar_is_high((secp256k1_scalar *)local_68);
    if (sigout != (secp256k1_ecdsa_signature *)0x0) {
      if (ctx_local._4_4_ != 0) {
        secp256k1_scalar_negate((secp256k1_scalar *)local_68,(secp256k1_scalar *)local_68);
      }
      secp256k1_ecdsa_signature_save
                (sigout,(secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)local_68);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_signature_normalize(const secp256k1_context* ctx, secp256k1_ecdsa_signature *sigout, const secp256k1_ecdsa_signature *sigin) {
    secp256k1_scalar r, s;
    int ret = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sigin != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sigin);
    ret = secp256k1_scalar_is_high(&s);
    if (sigout != NULL) {
        if (ret) {
            secp256k1_scalar_negate(&s, &s);
        }
        secp256k1_ecdsa_signature_save(sigout, &r, &s);
    }

    return ret;
}